

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge_sub.c
# Opt level: O0

void crypto_sign_ed25519_ref10_ge_sub(ge_p1p1 *r,ge_p3 *p,ge_cached *q)

{
  int32_t *in_RSI;
  int32_t *in_RDI;
  fe t0;
  int32_t *in_stack_00000378;
  int32_t *in_stack_00000380;
  int32_t *in_stack_00000388;
  int32_t aiStack_48 [14];
  int32_t *local_10;
  int32_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  crypto_sign_ed25519_ref10_fe_add(in_RDI,in_RSI + 10,in_RSI);
  crypto_sign_ed25519_ref10_fe_sub(local_8 + 10,local_10 + 10,local_10);
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000388,in_stack_00000380,in_stack_00000378);
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000388,in_stack_00000380,in_stack_00000378);
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000388,in_stack_00000380,in_stack_00000378);
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000388,in_stack_00000380,in_stack_00000378);
  crypto_sign_ed25519_ref10_fe_add(aiStack_48,local_8,local_8);
  crypto_sign_ed25519_ref10_fe_sub(local_8,local_8 + 0x14,local_8 + 10);
  crypto_sign_ed25519_ref10_fe_add(local_8 + 10,local_8 + 0x14,local_8 + 10);
  crypto_sign_ed25519_ref10_fe_sub(local_8 + 0x14,aiStack_48,local_8 + 0x1e);
  crypto_sign_ed25519_ref10_fe_add(local_8 + 0x1e,aiStack_48,local_8 + 0x1e);
  return;
}

Assistant:

void ge_sub(ge_p1p1 *r,const ge_p3 *p,const ge_cached *q)
{
  fe t0;
#include "ge_sub.h"
}